

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_partitioned_aggregate.cpp
# Opt level: O2

void __thiscall
duckdb::PartitionedAggregateGlobalSourceState::~PartitionedAggregateGlobalSourceState
          (PartitionedAggregateGlobalSourceState *this)

{
  ~PartitionedAggregateGlobalSourceState(this);
  operator_delete(this);
  return;
}

Assistant:

explicit PartitionedAggregateGlobalSourceState(PartitionedAggregateGlobalSinkState &gstate) {
		gstate.aggregate_result.InitializeScan(scan_state);
	}